

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

double var(double *vec,int N)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = mean(vec,N);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  dVar4 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar4 = dVar4 + (vec[uVar1] - dVar3) * (vec[uVar1] - dVar3);
  }
  return dVar4 / (double)N;
}

Assistant:

double var(double* vec, int N) {
	double v,temp,m;
	int i;
	v = 0.0;	
	m = mean(vec,N);
	
	for (i = 0; i < N; ++i) {
		temp = vec[i] - m;
		v+= temp*temp;
	}
	
	v = v / N;
	
	return v;
	
}